

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O0

void libcmselect_LTX_select_free(CMtrans_services svc,CManager_conflict cm,void *client_data)

{
  select_data_ptr psVar1;
  select_data_ptr *in_RDX;
  CMtrans_services in_RSI;
  long in_RDI;
  select_data_ptr sd;
  select_data_ptr *sdp;
  
  psVar1 = *in_RDX;
  (**(code **)(in_RDI + 0x38))(psVar1->cm,7,"CMSelect free task called");
  if (*in_RDX != (select_data_ptr)0x0) {
    close(psVar1->wake_read_fd);
    close(psVar1->wake_write_fd);
    free_select_data(in_RSI,in_RDX);
  }
  return;
}

Assistant:

extern void
libcmselect_LTX_select_free(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMFreeVerbose, "CMSelect free task called");

    if (*((select_data_ptr *)client_data) != NULL) {
	close(sd->wake_read_fd);
	close(sd->wake_write_fd);
	free_select_data(svc, sdp);
    }
}